

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputAddTarget(HelicsInput ipt,char *target,HelicsError *err)

{
  Input *this;
  InputObject *pIVar1;
  size_t sVar2;
  string_view target_00;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(ipt,err);
  if (pIVar1 != (InputObject *)0x0) {
    if (target != (char *)0x0) {
      this = pIVar1->inputPtr;
      sVar2 = strlen(target);
      target_00._M_str = target;
      target_00._M_len = sVar2;
      helics::Input::addPublication(this,target_00);
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "The supplied string argument is null and therefore invalid";
    }
  }
  return;
}

Assistant:

void helicsInputAddTarget(HelicsInput ipt, const char* target, HelicsError* err)
{
    auto* inpObj = verifyInput(ipt, err);
    if (inpObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(target, void());
    inpObj->inputPtr->addTarget(target);
}